

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:330:50)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:330:50)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  anon_class_8_1_8991fb9c_for_f aVar1;
  TutorialApplication *pTVar2;
  Ref<embree::ParseStream> *cin_00;
  long *in_RSI;
  long in_RDI;
  FileName *in_stack_ffffffffffffff98;
  anon_class_8_1_8991fb9c_for_f *this_00;
  anon_class_8_1_8991fb9c_for_f local_40 [5];
  anon_class_8_1_8991fb9c_for_f *local_18;
  anon_class_8_1_8991fb9c_for_f *local_10;
  
  cin_00 = (Ref<embree::ParseStream> *)(in_RDI + 0x30);
  this_00 = local_40;
  aVar1.this = (SceneLoadingTutorialApplication *)*in_RSI;
  local_18 = this_00;
  if (aVar1.this != (SceneLoadingTutorialApplication *)0x0) {
    pTVar2 = &(local_40[0].this)->super_TutorialApplication;
    local_40[0].this = aVar1.this;
    (*(pTVar2->super_Application)._vptr_Application[2])();
    aVar1.this = local_40[0].this;
  }
  local_40[0].this = aVar1.this;
  anon_class_8_1_8991fb9c_for_f::operator()(this_00,cin_00,in_stack_ffffffffffffff98);
  local_10 = local_40;
  if (local_40[0].this != (SceneLoadingTutorialApplication *)0x0) {
    (*((local_40[0].this)->super_TutorialApplication).super_Application._vptr_Application[3])();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }